

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O1

string * __thiscall
lrit::TimeStampHeader::getTimeShort_abi_cxx11_(string *__return_storage_ptr__,TimeStampHeader *this)

{
  tm *__tp;
  size_t sVar1;
  timespec ts;
  array<char,_128UL> tsbuf;
  timespec local_a0;
  char local_90 [128];
  
  local_a0 = getUnix(this);
  __tp = gmtime(&local_a0.tv_sec);
  sVar1 = strftime(local_90,0x80,"%Y%m%d-%H%M%S",__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_90,local_90 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeStampHeader::getTimeShort() const {
  std::array<char, 128> tsbuf;
  auto ts = getUnix();
  auto len = strftime(
    tsbuf.data(),
    tsbuf.size(),
    "%Y%m%d-%H%M%S",
    gmtime(&ts.tv_sec));
  return std::string(tsbuf.data(), len);
}